

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeQueue.h
# Opt level: O0

void __thiscall
NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
::Push(NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
       *this,DataNode *node)

{
  bool bVar1;
  DataNode *node_local;
  NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
  *this_local;
  
  node->next = this->head_;
  node->last = (DataNode *)0x0;
  bVar1 = Empty(this);
  if (bVar1) {
    this->tail_ = node;
    this->tail_->next = (DataNode *)0x0;
  }
  else {
    this->head_->last = node;
  }
  this->head_ = node;
  return;
}

Assistant:

void Push(NODE *node) {
        node->next = head_;
        node->last = nullptr;
        if (!Empty())
            head_->last = node;
        else {
            tail_ = node;
            tail_->next = nullptr;
        }
        head_ = node;
    }